

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

uint64_t roaring64_bitmap_range_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ushort uVar1;
  bool bVar2;
  art_val_t *paVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t x;
  uint uVar9;
  uint uVar10;
  run_container_t *prVar11;
  ushort x_00;
  uint64_t uVar12;
  uint8_t max_high48 [6];
  uint8_t min_high48 [6];
  art_iterator_t it;
  uint local_d0;
  ushort local_cc;
  uint local_c8;
  ushort local_c4;
  uint64_t local_c0;
  art_iterator_t local_b8;
  
  if (min < max) {
    uVar8 = max - 1;
    local_c8 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_c4 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_d0 = (uint)(byte)(uVar8 >> 0x38) | (uint)((uVar8 & 0xff00000000ffff) >> 0x28) |
               (uint)(uVar8 >> 0x18) & 0xff0000 | (uint)(uVar8 >> 8) & 0xff000000;
    local_cc = (ushort)(uVar8 >> 0x18) & 0xff | (ushort)(uVar8 >> 8) & 0xff00;
    art_lower_bound(&local_b8,&r->art,(art_key_chunk_t *)&local_c8);
    x_00 = (short)min - 1;
    uVar12 = 0;
    local_c0 = min;
    do {
      if (local_b8.value == (art_val_t *)0x0) {
        return uVar12;
      }
      iVar5 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_d0);
      paVar3 = local_b8.value;
      if (iVar5 < 1) {
        prVar11 = *(run_container_t **)(local_b8.value[1].key + 2);
        bVar4 = local_b8.value[1].key[0];
        if (iVar5 == 0) {
          if (bVar4 == 4) {
            bVar4 = *(byte *)&prVar11->runs;
            prVar11 = *(run_container_t **)prVar11;
          }
          x = (uint16_t)(uVar8 & 0xff00000000ffff);
          if (bVar4 == 3) {
            uVar7 = run_container_rank(prVar11,x);
          }
          else if (bVar4 == 2) {
            iVar6 = prVar11->n_runs + -1;
            uVar10 = 0;
            uVar7 = (uint)bVar4;
            do {
              if (iVar6 < (int)uVar10) {
                uVar9 = ~uVar10;
                break;
              }
              uVar9 = uVar10 + iVar6 >> 1;
              uVar1 = *(ushort *)
                       ((long)&prVar11->runs->value + (ulong)(uVar10 + iVar6 & 0xfffffffe));
              if (uVar1 < (ushort)uVar8) {
                uVar10 = uVar9 + 1;
                bVar2 = true;
                uVar9 = uVar7;
              }
              else if ((ushort)uVar8 < uVar1) {
                iVar6 = uVar9 - 1;
                bVar2 = true;
                uVar9 = uVar7;
              }
              else {
                bVar2 = false;
              }
              uVar7 = uVar9;
            } while (bVar2);
            uVar7 = ~uVar9;
            if (-1 < (int)uVar9) {
              uVar7 = uVar9 + 1;
            }
          }
          else {
            uVar7 = bitset_container_rank((bitset_container_t *)prVar11,x);
          }
        }
        else {
          if (bVar4 == 4) {
            bVar4 = *(byte *)&prVar11->runs;
            prVar11 = *(run_container_t **)prVar11;
          }
          if (bVar4 == 3) {
            uVar7 = run_container_cardinality(prVar11);
          }
          else {
            uVar7 = prVar11->n_runs;
          }
        }
        uVar12 = uVar12 + (long)(int)uVar7;
        iVar6 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c8);
        if (((short)local_c0 != 0) && (iVar6 == 0)) {
          prVar11 = *(run_container_t **)(paVar3[1].key + 2);
          bVar4 = paVar3[1].key[0];
          if (bVar4 == 4) {
            bVar4 = *(byte *)&prVar11->runs;
            prVar11 = *(run_container_t **)prVar11;
          }
          if (bVar4 == 3) {
            uVar7 = run_container_rank(prVar11,x_00);
          }
          else if (bVar4 == 2) {
            iVar6 = prVar11->n_runs + -1;
            uVar10 = 0;
            uVar7 = (uint)bVar4;
            do {
              if (iVar6 < (int)uVar10) {
                uVar9 = ~uVar10;
                break;
              }
              uVar9 = uVar10 + iVar6 >> 1;
              uVar1 = *(ushort *)
                       ((long)&prVar11->runs->value + (ulong)(uVar10 + iVar6 & 0xfffffffe));
              if (uVar1 < x_00) {
                uVar10 = uVar9 + 1;
                bVar2 = true;
                uVar9 = uVar7;
              }
              else if (x_00 < uVar1) {
                iVar6 = uVar9 - 1;
                bVar2 = true;
                uVar9 = uVar7;
              }
              else {
                bVar2 = false;
              }
              uVar7 = uVar9;
            } while (bVar2);
            uVar7 = ~uVar9;
            if (-1 < (int)uVar9) {
              uVar7 = uVar9 + 1;
            }
          }
          else {
            uVar7 = bitset_container_rank((bitset_container_t *)prVar11,x_00);
          }
          uVar12 = uVar12 - (long)(int)uVar7;
        }
        art_iterator_next(&local_b8);
      }
    } while (iVar5 < 1);
  }
  else {
    uVar12 = 0;
  }
  return uVar12;
}

Assistant:

uint64_t roaring64_bitmap_range_cardinality(const roaring64_bitmap_t *r,
                                            uint64_t min, uint64_t max) {
    if (min >= max) {
        return 0;
    }
    max--;  // A closed range is easier to work with.

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound(&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t *leaf = (leaf_t *)it.value;
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality +=
                container_rank(leaf->container, leaf->typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality +=
                container_get_cardinality(leaf->container, leaf->typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -=
                container_rank(leaf->container, leaf->typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}